

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O1

FILE * Io_FileOpen(char *FileName,char *PathVar,char *Mode,int fVerbose)

{
  char *pcVar1;
  char *pcVar2;
  FILE *pFVar3;
  char ActualFileName [4096];
  char local_1038 [4104];
  
  if (PathVar != (char *)0x0) {
    pcVar1 = Abc_FrameReadFlag(PathVar);
    if (pcVar1 != (char *)0x0) {
      pcVar1 = Extra_UtilStrsav(pcVar1);
      pcVar2 = strtok(pcVar1,":");
      if (pcVar2 != (char *)0x0) {
        do {
          snprintf(local_1038,0x1000,"%s/%s",pcVar2,FileName);
          pFVar3 = fopen(local_1038,Mode);
          if (pFVar3 != (FILE *)0x0) {
            if (fVerbose != 0) {
              fprintf(_stdout,"Using file %s\n",local_1038);
            }
            goto LAB_00339329;
          }
          pcVar2 = strtok((char *)0x0,":");
        } while (pcVar2 != (char *)0x0);
      }
      pFVar3 = (FILE *)0x0;
LAB_00339329:
      if (pcVar1 != (char *)0x0) {
        free(pcVar1);
      }
      return (FILE *)pFVar3;
    }
  }
  pFVar3 = fopen(FileName,Mode);
  return (FILE *)pFVar3;
}

Assistant:

FILE * Io_FileOpen( const char * FileName, const char * PathVar, const char * Mode, int fVerbose )
{
    char * t = 0, * c = 0, * i;

    if ( PathVar == 0 )
    {
        return fopen( FileName, Mode );
    }
    else
    {
        if ( (c = Abc_FrameReadFlag( (char*)PathVar )) )
        {
            char ActualFileName[4096];
            FILE * fp = 0;
            t = Extra_UtilStrsav( c );
            for (i = strtok( t, ":" ); i != 0; i = strtok( 0, ":") )
            {
#ifdef WIN32
                _snprintf ( ActualFileName, 4096, "%s/%s", i, FileName );
#else
                snprintf ( ActualFileName, 4096, "%s/%s", i, FileName );
#endif
                if ( ( fp = fopen ( ActualFileName, Mode ) ) )
                {
                    if ( fVerbose )
                    fprintf ( stdout, "Using file %s\n", ActualFileName );
                    ABC_FREE( t );
                    return fp;
                }
            }
            ABC_FREE( t );
            return 0;
        }
        else
        {
            return fopen( FileName, Mode );
        }
    }
}